

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

void cvFreeVectors(CVodeMem cv_mem)

{
  int iVar1;
  long in_RDI;
  int maxord;
  int j;
  undefined4 local_c;
  
  iVar1 = *(int *)(in_RDI + 0x830);
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1b8));
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1c8));
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1d0));
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1d8));
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1e0));
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1e8));
  N_VDestroy(*(undefined8 *)(in_RDI + 0x1f0));
  for (local_c = 0; local_c <= iVar1; local_c = local_c + 1) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x150 + (long)local_c * 8));
  }
  *(long *)(in_RDI + 0x718) =
       *(long *)(in_RDI + 0x718) - (long)(iVar1 + 8) * *(long *)(in_RDI + 0x6f8);
  *(long *)(in_RDI + 0x720) =
       *(long *)(in_RDI + 0x720) - (long)(iVar1 + 8) * *(long *)(in_RDI + 0x700);
  if (*(int *)(in_RDI + 0x844) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x38));
    *(long *)(in_RDI + 0x718) = *(long *)(in_RDI + 0x718) - *(long *)(in_RDI + 0x6f8);
    *(long *)(in_RDI + 0x720) = *(long *)(in_RDI + 0x720) - *(long *)(in_RDI + 0x700);
  }
  if (*(int *)(in_RDI + 0x84c) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x1f8));
    *(long *)(in_RDI + 0x718) = *(long *)(in_RDI + 0x718) - *(long *)(in_RDI + 0x6f8);
    *(long *)(in_RDI + 0x720) = *(long *)(in_RDI + 0x720) - *(long *)(in_RDI + 0x700);
  }
  return;
}

Assistant:

static void cvFreeVectors(CVodeMem cv_mem)
{
  int j, maxord;

  maxord = cv_mem->cv_qmax_alloc;

  N_VDestroy(cv_mem->cv_ewt);
  N_VDestroy(cv_mem->cv_acor);
  N_VDestroy(cv_mem->cv_tempv);
  N_VDestroy(cv_mem->cv_ftemp);
  N_VDestroy(cv_mem->cv_vtemp1);
  N_VDestroy(cv_mem->cv_vtemp2);
  N_VDestroy(cv_mem->cv_vtemp3);
  for (j = 0; j <= maxord; j++) { N_VDestroy(cv_mem->cv_zn[j]); }

  cv_mem->cv_lrw -= (maxord + 8) * cv_mem->cv_lrw1;
  cv_mem->cv_liw -= (maxord + 8) * cv_mem->cv_liw1;

  if (cv_mem->cv_VabstolMallocDone)
  {
    N_VDestroy(cv_mem->cv_Vabstol);
    cv_mem->cv_lrw -= cv_mem->cv_lrw1;
    cv_mem->cv_liw -= cv_mem->cv_liw1;
  }

  if (cv_mem->cv_constraintsMallocDone)
  {
    N_VDestroy(cv_mem->cv_constraints);
    cv_mem->cv_lrw -= cv_mem->cv_lrw1;
    cv_mem->cv_liw -= cv_mem->cv_liw1;
  }
}